

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmanvector.h
# Opt level: O2

void __thiscall TPZManVector<int,_18>::TPZManVector(TPZManVector<int,_18> *this,int64_t size)

{
  int *piVar1;
  int64_t iVar2;
  
  TPZVec<int>::TPZVec(&this->super_TPZVec<int>,0);
  (this->super_TPZVec<int>)._vptr_TPZVec = (_func_int **)&PTR__TPZManVector_016f2d28;
  if (size < 0x13) {
    piVar1 = this->fExtAlloc;
    iVar2 = 0;
  }
  else {
    piVar1 = (int *)operator_new__(-(ulong)((ulong)size >> 0x3e != 0) | size * 4);
    iVar2 = size;
  }
  (this->super_TPZVec<int>).fStore = piVar1;
  (this->super_TPZVec<int>).fNElements = size;
  (this->super_TPZVec<int>).fNAlloc = iVar2;
  return;
}

Assistant:

TPZManVector< T, NumExtAlloc >::TPZManVector(const int64_t size) :
TPZVec<T>(0) // There is always some static allocation.
{
    /* If the size requested fits inside the size already provided
     * statically, provides access to that space, by setting some
     * TPZVec data.
     */
    if (size <= NumExtAlloc) {
        // Needed to make TPZVec::operator[] work properly.
        this->fStore = fExtAlloc;
        this->fNElements = size;
        // No memory was allocated by the constructor.
        this->fNAlloc = 0;
    } else // The size requested is bigger than the size already provided.
    {
        // Executes the allocation that would be done by TPZVec<T>(size).
        this->fStore = new T[ size ];
        this->fNElements = size;
        this->fNAlloc = size;
    }
}